

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

menu_conflict * menu_dynamic_new(void)

{
  menu_conflict *m;
  
  m = (menu_conflict *)mem_alloc(0xb0);
  memset(m,0,0xb0);
  m->row_funcs = &dynamic_iter;
  m->skin = &menu_skin_scroll;
  m->cursor = 0;
  m->cursor_x_offset = 0;
  m->count = 0;
  m->menu_data = (void *)0x0;
  menu_ensure_cursor_valid(m);
  return m;
}

Assistant:

struct menu *menu_new(skin_id id, const menu_iter *iter)
{
	struct menu *m = mem_alloc(sizeof *m);
	menu_init(m, id, iter);
	return m;
}